

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O0

bool anon_unknown.dwarf_d28b::readData
               (istream *input,vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *output)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  Severity SVar4;
  cx_string<2UL> cVar5;
  cx_string<4UL> cVar6;
  SessionWriter *pSVar7;
  data_ref pacVar8;
  size_t sVar9;
  data_ref pacVar10;
  char *pcVar11;
  data_ref pacVar12;
  uint64_t eventSourceId;
  long *in_RDI;
  uint64_t _binlog_sid_v_3;
  vector<char,_std::allocator<char>_> data;
  ReadResult dataview;
  QueueReader reader;
  uint64_t _binlog_sid_v_2;
  bad_alloc *anon_var_0;
  vector<char,_std::allocator<char>_> queueBuffer;
  uint64_t _binlog_sid_v_1;
  uint64_t _binlog_sid_v;
  Queue queue;
  uintptr_t session;
  void *sessionptr;
  memory_order __b_10;
  memory_order __b_8;
  memory_order __b_6;
  memory_order __b_5;
  memory_order __b_4;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  memory_order __b_11;
  memory_order __b_9;
  memory_order __b_7;
  memory_order __b_3;
  value_type *in_stack_fffffffffffff678;
  EventSource *in_stack_fffffffffffff680;
  char (*in_stack_fffffffffffff688) [67];
  __atomic_base<unsigned_long> in_stack_fffffffffffff690;
  unsigned_long *in_stack_fffffffffffff698;
  SessionWriter *in_stack_fffffffffffff6a0;
  EventSource *in_stack_fffffffffffff6a8;
  atomic<unsigned_long> *paVar13;
  undefined4 in_stack_fffffffffffff6b0;
  undefined4 in_stack_fffffffffffff6b4;
  unsigned_long *in_stack_fffffffffffff6b8;
  QueueReader *in_stack_fffffffffffff6c0;
  const_iterator in_stack_fffffffffffff6c8;
  allocator *paVar14;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff840;
  allocator local_5a1;
  size_type local_5a0;
  cx_string<2UL> local_597;
  allocator local_594;
  allocator local_593;
  allocator local_592;
  allocator local_591;
  undefined8 local_590;
  undefined2 local_588;
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  undefined8 local_520;
  string local_518 [32];
  string local_4f8 [32];
  __atomic_base<unsigned_long> local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4b8;
  char *local_4b0;
  Queue *in_stack_fffffffffffffb70;
  ReadResult local_488;
  QueueReader local_468;
  undefined4 local_458;
  vector<char,_std::allocator<char>_> local_380;
  undefined1 local_363;
  undefined1 local_362;
  undefined1 local_361;
  undefined1 local_360;
  allocator local_35f;
  cx_string<1UL> local_35e;
  allocator local_35c;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  undefined8 local_358;
  undefined2 local_350;
  string local_348 [32];
  string local_328 [32];
  string local_308 [32];
  undefined8 local_2e8;
  string local_2e0 [32];
  string local_2c0 [32];
  __atomic_base<unsigned_long> local_2a0;
  undefined1 local_298 [24];
  __int_type local_280;
  uintptr_t local_278;
  cx_string<4UL> local_26c;
  allocator local_267;
  allocator local_266;
  allocator local_265 [20];
  allocator local_251;
  undefined8 local_250;
  undefined2 local_248;
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  undefined8 local_1e0;
  string local_1d8 [32];
  string local_1b8 [32];
  __atomic_base<unsigned_long> local_198;
  undefined1 local_190 [16];
  ulong local_180;
  char *local_178;
  __atomic_base<unsigned_long> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_168;
  long *local_150;
  byte local_141;
  __atomic_base<unsigned_long> local_140;
  memory_order local_138;
  undefined4 local_134;
  atomic<unsigned_long> *local_130;
  __atomic_base<unsigned_long> local_110;
  memory_order local_108;
  undefined4 local_104;
  atomic<unsigned_long> *local_100;
  memory_order local_f0;
  undefined4 local_ec;
  __atomic_base<unsigned_long> *local_e8;
  memory_order local_d8;
  undefined4 local_d4;
  undefined1 *local_d0;
  memory_order local_c0;
  undefined4 local_bc;
  __atomic_base<unsigned_long> *local_b8;
  memory_order local_a8;
  undefined4 local_a4;
  undefined1 *local_a0;
  __atomic_base<unsigned_long> local_98;
  memory_order local_90;
  undefined4 local_8c;
  atomic<unsigned_long> *local_88;
  SessionWriter *local_80;
  memory_order local_78;
  int local_74;
  SessionWriter *local_70;
  atomic<unsigned_long> *local_68;
  __int_type local_40;
  memory_order local_38;
  int local_34;
  __atomic_base<unsigned_long> local_30;
  atomic<unsigned_long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<unsigned_long> local_10;
  atomic<unsigned_long> *local_8;
  
  local_168._8_8_ = 0;
  local_150 = in_RDI;
  std::istream::read((char *)in_RDI,(long)&local_168 + 8);
  local_168._M_allocated_capacity = local_168._8_8_;
  binlog::detail::Queue::Queue
            ((Queue *)in_stack_fffffffffffff690._M_i,*in_stack_fffffffffffff688,
             (size_t)in_stack_fffffffffffff680);
  std::istream::read((char *)local_150,(long)local_190);
  bVar2 = checkQueueInvariants(in_stack_fffffffffffffb70);
  if (bVar2) {
    pSVar7 = binlog::default_thread_local_writer();
    binlog::SessionWriter::session(pSVar7);
    SVar4 = binlog::Session::minSeverity((Session *)0x10c120);
    if (SVar4 < 0x81) {
      local_88 = &readData::_binlog_sid;
      local_8c = 0;
      local_90 = std::operator&(memory_order_relaxed,__memory_order_mask);
      local_98 = readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      local_198 = readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
      if (readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
        pSVar7 = binlog::default_thread_local_writer();
        binlog::SessionWriter::session(pSVar7);
        local_250 = 0;
        local_248 = 0x80;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"main",&local_251);
        local_298[0x13] = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_220,"readData",local_265);
        local_298[0x14] = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_200,
                   "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp"
                   ,&local_266);
        local_298[0x15] = 1;
        local_1e0 = 200;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_1d8,"  Queue state is valid: capacity={} windex={} rindex={} dataend={}",
                   &local_267);
        local_298[0x16] = 1;
        local_a0 = local_190;
        local_a4 = 5;
        local_a8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_278 = local_190._0_8_;
        local_b8 = &local_170;
        local_bc = 5;
        local_c0 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_280 = local_170._M_i;
        cVar6 = binlog::detail::
                concatenated_tags<char_const(&)[67],unsigned_long&,unsigned_long,unsigned_long,unsigned_long&>
                          ((char (*) [67])in_stack_fffffffffffff6a8,
                           (unsigned_long *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                           (unsigned_long *)in_stack_fffffffffffff690._M_i,
                           (unsigned_long *)in_stack_fffffffffffff688);
        local_26c._data._0_4_ = cVar6._data._0_4_;
        local_26c._data[4] = cVar6._data[4];
        pacVar8 = mserialize::cx_string<4UL>::data(&local_26c);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1b8,*pacVar8,(allocator *)(local_298 + 0x17));
        local_298[0x16] = 0;
        local_298[0x15] = 0;
        local_298[0x14] = 0;
        local_298[0x13] = 0;
        local_198._M_i =
             binlog::Session::addEventSource
                       ((Session *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                        in_stack_fffffffffffff6a8);
        binlog::EventSource::~EventSource(in_stack_fffffffffffff680);
        std::allocator<char>::~allocator((allocator<char> *)(local_298 + 0x17));
        std::allocator<char>::~allocator((allocator<char> *)&local_267);
        std::allocator<char>::~allocator((allocator<char> *)&local_266);
        std::allocator<char>::~allocator((allocator<char> *)local_265);
        std::allocator<char>::~allocator((allocator<char> *)&local_251);
        local_8 = &readData::_binlog_sid;
        local_10._M_i = local_198._M_i;
        local_14 = 5;
        local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
        local_20 = local_10._M_i;
        if ((local_14 != 3) && (local_14 == 5)) {
          LOCK();
          UNLOCK();
        }
        readData::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_10._M_i;
      }
      binlog::default_thread_local_writer();
      binlog::clockNow();
      local_d0 = local_190;
      local_d4 = 5;
      local_d8 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_298._8_8_ = local_190._0_8_;
      local_e8 = &local_170;
      local_ec = 5;
      local_f0 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_298._0_8_ = local_170._M_i;
      in_stack_fffffffffffff680 = (EventSource *)(local_190 + 8);
      in_stack_fffffffffffff678 = (value_type *)local_298;
      binlog::detail::
      addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[67],unsigned_long&,unsigned_long,unsigned_long,unsigned_long&>
                (in_stack_fffffffffffff6a0,(uint64_t)in_stack_fffffffffffff698,
                 in_stack_fffffffffffff690._M_i,in_stack_fffffffffffff688,
                 (unsigned_long *)in_stack_fffffffffffff680,
                 (unsigned_long *)in_stack_fffffffffffff678,
                 (unsigned_long *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                 in_stack_fffffffffffff6b8);
    }
    printLogs();
    sVar9 = remainingSize((istream *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0));
    if (sVar9 < local_180) {
      pSVar7 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar7);
      SVar4 = binlog::Session::minSeverity((Session *)0x10cb0b);
      if (SVar4 < 0x201) {
        local_100 = &(anonymous_namespace)::
                     readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                     ::_binlog_sid;
        local_104 = 0;
        local_108 = std::operator&(memory_order_relaxed,__memory_order_mask);
        local_110 = (anonymous_namespace)::
                    readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                    ::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
        local_2a0 = (anonymous_namespace)::
                    readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                    ::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
        if ((anonymous_namespace)::
            readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)::
            _binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
          pSVar7 = binlog::default_thread_local_writer();
          binlog::SessionWriter::session(pSVar7);
          local_358 = 0;
          local_350 = 0x200;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_348,"main",&local_359);
          local_363 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_328,"readData",&local_35a);
          local_362 = 1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp"
                     ,&local_35b);
          local_361 = 1;
          local_2e8 = 0xcd;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2e0,"  Input doesn\'t have {} bytes",&local_35c);
          local_360 = 1;
          local_35e = binlog::detail::concatenated_tags<char_const(&)[30],unsigned_long&>
                                ((char (*) [30])in_stack_fffffffffffff688,
                                 &in_stack_fffffffffffff680->id);
          pacVar10 = mserialize::cx_string<1UL>::data(&local_35e);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2c0,*pacVar10,&local_35f);
          local_360 = 0;
          local_361 = 0;
          local_362 = 0;
          local_363 = 0;
          local_2a0._M_i =
               binlog::Session::addEventSource
                         ((Session *)CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                          in_stack_fffffffffffff6a8);
          binlog::EventSource::~EventSource(in_stack_fffffffffffff680);
          std::allocator<char>::~allocator((allocator<char> *)&local_35f);
          std::allocator<char>::~allocator((allocator<char> *)&local_35c);
          std::allocator<char>::~allocator((allocator<char> *)&local_35b);
          std::allocator<char>::~allocator((allocator<char> *)&local_35a);
          std::allocator<char>::~allocator((allocator<char> *)&local_359);
          local_28 = &(anonymous_namespace)::
                      readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                      ::_binlog_sid;
          local_30._M_i = local_2a0._M_i;
          local_34 = 5;
          local_38 = std::operator&(memory_order_seq_cst,__memory_order_mask);
          local_40 = local_30._M_i;
          if ((local_34 != 3) && (local_34 == 5)) {
            LOCK();
            UNLOCK();
          }
          (anonymous_namespace)::
          readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)::
          _binlog_sid.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)local_30._M_i;
        }
        binlog::default_thread_local_writer();
        binlog::clockNow();
        binlog::detail::addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[30],unsigned_long&>
                  ((SessionWriter *)in_stack_fffffffffffff690._M_i,
                   (uint64_t)in_stack_fffffffffffff688,(uint64_t)in_stack_fffffffffffff680,
                   (char (*) [30])in_stack_fffffffffffff678,(unsigned_long *)0x10d0f5);
      }
      printLogs();
      local_141 = 0;
    }
    else {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x10d120);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff6a0,
                 (size_type)in_stack_fffffffffffff698);
      plVar1 = local_150;
      pcVar11 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x10d838);
      std::vector<char,_std::allocator<char>_>::size(&local_380);
      std::istream::read((char *)plVar1,(long)pcVar11);
      bVar3 = std::ios::operator!((ios *)((long)local_150 + *(long *)(*local_150 + -0x18)));
      if ((bVar3 & 1) == 0) {
        local_178 = std::vector<char,_std::allocator<char>_>::data
                              ((vector<char,_std::allocator<char>_> *)0x10d8b9);
        binlog::detail::QueueReader::QueueReader(&local_468,(Queue *)local_190);
        binlog::detail::QueueReader::beginRead(in_stack_fffffffffffff6c0);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)0x10d904);
        binlog::detail::QueueReader::ReadResult::size(&local_488);
        std::vector<char,_std::allocator<char>_>::reserve
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                   (size_type)in_stack_fffffffffffff6a8);
        local_4b0 = (char *)std::vector<char,_std::allocator<char>_>::end
                                      ((vector<char,_std::allocator<char>_> *)
                                       in_stack_fffffffffffff678);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_fffffffffffff680,
                   (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_fffffffffffff678);
        local_4b8 = (char *)std::vector<char,std::allocator<char>>::insert<char_const*,void>
                                      ((vector<char,_std::allocator<char>_> *)
                                       in_stack_fffffffffffff6c0,in_stack_fffffffffffff6c8,
                                       (char *)in_stack_fffffffffffff6b8,
                                       (char *)CONCAT44(in_stack_fffffffffffff6b4,
                                                        in_stack_fffffffffffff6b0));
        local_4c8 = (char *)std::vector<char,_std::allocator<char>_>::end
                                      ((vector<char,_std::allocator<char>_> *)
                                       in_stack_fffffffffffff678);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_fffffffffffff680,
                   (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_fffffffffffff678);
        local_4d0 = (char *)std::vector<char,std::allocator<char>>::insert<char_const*,void>
                                      ((vector<char,_std::allocator<char>_> *)
                                       in_stack_fffffffffffff6c0,in_stack_fffffffffffff6c8,
                                       (char *)in_stack_fffffffffffff6b8,
                                       (char *)CONCAT44(in_stack_fffffffffffff6b4,
                                                        in_stack_fffffffffffff6b0));
        bVar2 = checkEntryBuffer(in_stack_fffffffffffff840);
        if (bVar2) {
          pSVar7 = binlog::default_thread_local_writer();
          binlog::SessionWriter::session(pSVar7);
          SVar4 = binlog::Session::minSeverity((Session *)0x10da8b);
          if (SVar4 < 0x81) {
            local_130 = &(anonymous_namespace)::
                         readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                         ::_binlog_sid;
            local_134 = 0;
            local_138 = std::operator&(memory_order_relaxed,__memory_order_mask);
            local_140 = (anonymous_namespace)::
                        readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                        ::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            local_4d8 = (anonymous_namespace)::
                        readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                        ::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
            if ((anonymous_namespace)::
                readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                ::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
              pSVar7 = binlog::default_thread_local_writer();
              binlog::SessionWriter::session(pSVar7);
              local_590 = 0;
              local_588 = 0x80;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_580,"main",&local_591);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_560,"readData",&local_592);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_540,
                         "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/bin/brecovery.cpp"
                         ,&local_593);
              local_520 = 0xeb;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_518,"  Recovered {} bytes of data from session={}",&local_594);
              local_5a0 = std::vector<char,_std::allocator<char>_>::size
                                    ((vector<char,_std::allocator<char>_> *)&stack0xfffffffffffffb60
                                    );
              cVar5 = binlog::detail::
                      concatenated_tags<char_const(&)[45],unsigned_long,unsigned_long_const&>
                                ((char (*) [45])in_stack_fffffffffffff688,
                                 &in_stack_fffffffffffff680->id,
                                 (unsigned_long *)in_stack_fffffffffffff678);
              local_597._data._0_2_ = cVar5._data._0_2_;
              local_597._data[2] = cVar5._data[2];
              pacVar12 = mserialize::cx_string<2UL>::data(&local_597);
              paVar14 = &local_5a1;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_4f8,*pacVar12,paVar14);
              local_4d8._M_i =
                   binlog::Session::addEventSource
                             ((Session *)
                              CONCAT44(in_stack_fffffffffffff6b4,in_stack_fffffffffffff6b0),
                              in_stack_fffffffffffff6a8);
              binlog::EventSource::~EventSource(in_stack_fffffffffffff680);
              std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
              std::allocator<char>::~allocator((allocator<char> *)&local_594);
              std::allocator<char>::~allocator((allocator<char> *)&local_593);
              std::allocator<char>::~allocator((allocator<char> *)&local_592);
              std::allocator<char>::~allocator((allocator<char> *)&local_591);
              local_68 = &(anonymous_namespace)::
                          readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                          ::_binlog_sid;
              local_70 = (SessionWriter *)local_4d8._M_i;
              local_74 = 5;
              paVar13 = &(anonymous_namespace)::
                         readData(std::istream&,std::vector<RecoveredBuffer,std::allocator<RecoveredBuffer>>&)
                         ::_binlog_sid;
              local_78 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              local_80 = local_70;
              if (local_74 == 3) {
                (paVar13->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_70;
              }
              else if (local_74 == 5) {
                LOCK();
                (paVar13->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_70;
                UNLOCK();
              }
              else {
                (paVar13->super___atomic_base<unsigned_long>)._M_i = (__int_type)local_70;
              }
            }
            pSVar7 = binlog::default_thread_local_writer();
            in_stack_fffffffffffff690._M_i = local_4d8._M_i;
            eventSourceId = binlog::clockNow();
            std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)&stack0xfffffffffffffb60);
            binlog::detail::
            addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[45],unsigned_long,unsigned_long_const&>
                      (pSVar7,eventSourceId,in_stack_fffffffffffff690._M_i,
                       (char (*) [45])in_stack_fffffffffffff688,&in_stack_fffffffffffff680->id,
                       (unsigned_long *)in_stack_fffffffffffff678);
          }
          printLogs();
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff680,
                     (vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff678);
          std::vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_>::push_back
                    ((vector<RecoveredBuffer,_std::allocator<RecoveredBuffer>_> *)
                     in_stack_fffffffffffff680,in_stack_fffffffffffff678);
          RecoveredBuffer::~RecoveredBuffer((RecoveredBuffer *)0x10e0ed);
          local_141 = 1;
        }
        else {
          local_141 = 0;
        }
        local_458 = 1;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff690._M_i);
      }
      else {
        local_141 = 0;
        local_458 = 1;
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff690._M_i);
    }
  }
  else {
    local_141 = 0;
  }
  return (bool)(local_141 & 1);
}

Assistant:

bool readData(std::istream& input, std::vector<RecoveredBuffer>& output)
{
  // get session ptr as a number
  void* sessionptr = nullptr;
  input.read(reinterpret_cast<char*>(&sessionptr), sizeof(void*));
  const std::uintptr_t session = reinterpret_cast<std::uintptr_t>(sessionptr);

  // get queue with writer and reader positions
  // Depending on the standard/compiler, the assert below is invalid
  // because of the std::atomic inside Queue - but we do not care.
  // static_assert(std::is_trivially_copyable<binlog::detail::Queue>::value, "Queue must be trivial");
  binlog::detail::Queue queue(nullptr, 0);
  input.read(reinterpret_cast<char*>(&queue), sizeof(queue));

  if (! checkQueueInvariants(queue)) { return false; }

  STDERR_INFO("  Queue state is valid: capacity={} windex={} rindex={} dataend={}",
    queue.capacity, queue.writeIndex.load(), queue.readIndex.load(), queue.dataEnd);

  // get queue buffer
  if (queue.capacity > remainingSize(input))
  {
    STDERR_ERROR("  Input doesn't have {} bytes", queue.capacity);
    return false;
  }

  std::vector<char> queueBuffer;
  try
  {
    queueBuffer.resize(queue.capacity);
  }
  catch (const std::bad_alloc&)
  {
    STDERR_ERROR("  Failed to allocate {} bytes for queue data", queue.capacity);
    return false;
  }
  input.read(queueBuffer.data(), std::streamsize(queueBuffer.size()));

  if (! input) { return false; }

  // create a reader, get the unread data from the buffer
  queue.buffer = queueBuffer.data();
  binlog::detail::QueueReader reader(queue);
  const binlog::detail::QueueReader::ReadResult dataview = reader.beginRead();

  std::vector<char> data;
  data.reserve(dataview.size());
  data.insert(data.end(), dataview.buffer1, dataview.buffer1 + dataview.size1);
  data.insert(data.end(), dataview.buffer2, dataview.buffer2 + dataview.size2);

  if (! checkEntryBuffer(data)) { return false; }

  STDERR_INFO("  Recovered {} bytes of data from session={}", data.size(), session);

  output.push_back(RecoveredBuffer{BufferType::Data, session, std::move(data)});
  return true;
}